

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O0

ggml_cplan * ggml_graph_plan(ggml_cgraph *cgraph,int n_threads,ggml_threadpool *threadpool)

{
  ggml_type gVar1;
  undefined4 *puVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  ggml_threadpool *in_RCX;
  int in_EDX;
  long in_RSI;
  ggml_cplan *in_RDI;
  int64_t mxDn;
  int64_t ne11_2;
  int64_t D;
  int64_t ne20;
  int64_t ne10_2;
  int64_t ne12;
  int64_t ne11_1;
  int64_t ne10_1;
  int64_t ne03;
  int64_t ne02_1;
  int64_t ne01_1;
  int64_t ne00_1;
  int64_t ne11;
  int64_t ne10;
  int64_t ne02;
  int64_t ne01;
  int64_t ne00;
  int n_as;
  ggml_type vec_dot_type_1;
  ggml_tensor *ids;
  ggml_tensor *src1;
  ggml_tensor *src0;
  ggml_type vec_dot_type;
  size_t cur;
  int n_tasks;
  ggml_tensor *node;
  int i;
  int max_tasks;
  size_t work_size;
  int local_12c;
  ulong local_128;
  long local_120;
  size_t *in_stack_fffffffffffffef0;
  int iVar10;
  int in_stack_fffffffffffffefc;
  ggml_cplan *pgVar11;
  long in_stack_ffffffffffffff60;
  ggml_tensor *in_stack_ffffffffffffff68;
  ulong local_40;
  int local_28;
  int local_24;
  ulong local_20;
  int local_c;
  
  local_c = in_EDX;
  if (in_EDX < 1) {
    if (in_RCX == (ggml_threadpool *)0x0) {
      in_stack_fffffffffffffefc = 4;
      local_c = in_stack_fffffffffffffefc;
    }
    else {
      in_stack_fffffffffffffefc = in_RCX->n_threads_max;
      local_c = in_stack_fffffffffffffefc;
    }
  }
  local_20 = 0;
  pgVar11 = in_RDI;
  memset(in_RDI,0,0x30);
  local_24 = 1;
  local_28 = 0;
  do {
    if (*(int *)(in_RSI + 4) <= local_28) {
      if (local_20 != 0) {
        local_20 = (long)(local_c << 6) + local_20;
      }
      pgVar11->threadpool = in_RCX;
      if (local_24 < local_c) {
        local_12c = local_24;
      }
      else {
        local_12c = local_c;
      }
      pgVar11->n_threads = local_12c;
      pgVar11->work_size = local_20;
      pgVar11->work_data = (uint8_t *)0x0;
      return in_RDI;
    }
    puVar2 = *(undefined4 **)(*(long *)(in_RSI + 0x10) + (long)local_28 * 8);
    iVar4 = ggml_get_n_tasks(in_stack_ffffffffffffff68,
                             (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
    iVar10 = iVar4;
    if (iVar4 < local_24) {
      iVar10 = local_24;
    }
    local_40 = 0;
    bVar3 = ggml_cpu_extra_work_size
                      ((int)pgVar11,(ggml_tensor *)CONCAT44(in_stack_fffffffffffffefc,iVar10),
                       in_stack_fffffffffffffef0);
    if (!bVar3) {
      in_stack_fffffffffffffef0 = (size_t *)(ulong)(puVar2[0x14] - 1);
      switch(in_stack_fffffffffffffef0) {
      case (size_t *)0x0:
      case (size_t *)0x1f:
        uVar6 = ggml_is_quantized(*puVar2);
        if (((uVar6 & 1) != 0) ||
           ((((**(int **)(puVar2 + 0x26) == 1 && (*(long *)(puVar2 + 0x28) != 0)) &&
             (**(int **)(puVar2 + 0x28) == 0x1e)) ||
            (((**(int **)(puVar2 + 0x26) == 0x1e && (*(long *)(puVar2 + 0x28) != 0)) &&
             (**(int **)(puVar2 + 0x28) == 1)))))) {
          lVar9 = ggml_type_size(0);
          local_40 = lVar9 * *(long *)(puVar2 + 4) * (long)iVar4;
        }
        break;
      case (size_t *)0x1:
      case (size_t *)0x2:
        uVar6 = ggml_is_quantized(**(undefined4 **)(puVar2 + 0x26));
        if ((uVar6 & 1) != 0) {
          lVar9 = ggml_type_size(0);
          local_40 = lVar9 * *(long *)(*(long *)(puVar2 + 0x26) + 0x10) * (long)iVar4;
        }
        break;
      case (size_t *)0x3:
        uVar6 = ggml_is_quantized(**(undefined4 **)(puVar2 + 0x26));
        if ((uVar6 & 1) != 0) {
          lVar9 = ggml_type_size(0);
          local_40 = lVar9 * *(long *)(*(long *)(puVar2 + 0x28) + 0x10) * (long)iVar4;
        }
        break;
      default:
        break;
      case (size_t *)0x10:
        lVar9 = ggml_type_size(*puVar2);
        local_40 = lVar9 * iVar4;
        break;
      case (size_t *)0x1a:
        gVar1 = type_traits_cpu[**(uint **)(puVar2 + 0x26)].vec_dot_type;
        if (**(ggml_type **)(puVar2 + 0x28) != gVar1) {
          uVar7 = ggml_nelements(*(undefined8 *)(puVar2 + 0x28));
          local_40 = ggml_row_size(gVar1,uVar7);
        }
        break;
      case (size_t *)0x1b:
        local_40 = 0;
        lVar9 = *(long *)(puVar2 + 0x2a);
        gVar1 = type_traits_cpu[**(uint **)(puVar2 + 0x26)].vec_dot_type;
        iVar4 = (int)*(undefined8 *)(*(uint **)(puVar2 + 0x26) + 8);
        if (**(ggml_type **)(puVar2 + 0x28) != gVar1) {
          uVar7 = ggml_nelements(*(ggml_type **)(puVar2 + 0x28));
          lVar8 = ggml_row_size(gVar1,uVar7);
          local_40 = lVar8 + 8;
        }
        local_40 = (long)(iVar4 * 0x40 + 0x40) +
                   (long)iVar4 * *(long *)(lVar9 + 0x10) * *(long *)(lVar9 + 0x18) * 8 +
                   (long)iVar4 * 8 + 0x10 + local_40;
        break;
      case (size_t *)0x1c:
        uVar6 = ggml_is_quantized(**(undefined4 **)(puVar2 + 0x26));
        if ((uVar6 & 1) != 0) {
          lVar9 = ggml_type_size(0);
          local_40 = lVar9 * *(long *)(*(long *)(puVar2 + 0x26) + 0x10) * (long)iVar4;
        }
        break;
      case (size_t *)0x2a:
      case (size_t *)0x2c:
      case (size_t *)0x2d:
        lVar9 = ggml_type_size(0);
        local_40 = lVar9 * *(long *)(puVar2 + 4) * (long)iVar4;
        break;
      case (size_t *)0x2f:
        if (*(long *)(*(long *)(puVar2 + 0x26) + 0x28) != 1) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                     ,0xaba,"GGML_ASSERT(%s) failed","node->src[0]->ne[3] == 1");
        }
        if (*(long *)(*(long *)(puVar2 + 0x28) + 0x20) != 1) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                     ,0xabb,"GGML_ASSERT(%s) failed","node->src[1]->ne[2] == 1");
        }
        if (*(long *)(*(long *)(puVar2 + 0x28) + 0x28) != 1) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                     ,0xabc,"GGML_ASSERT(%s) failed","node->src[1]->ne[3] == 1");
        }
        if (((**(int **)(puVar2 + 0x26) == 1) || (**(int **)(puVar2 + 0x26) == 0x1e)) &&
           (**(int **)(puVar2 + 0x28) == 0)) {
          local_40 = *(long *)(*(long *)(puVar2 + 0x28) + 0x10) * 2 *
                     *(long *)(*(long *)(puVar2 + 0x28) + 0x18) +
                     *(long *)(*(long *)(puVar2 + 0x26) + 0x10) * 2 *
                     *(long *)(*(long *)(puVar2 + 0x26) + 0x18) *
                     *(long *)(*(long *)(puVar2 + 0x26) + 0x20);
        }
        else {
          if ((**(int **)(puVar2 + 0x26) != 0) || (**(int **)(puVar2 + 0x28) != 0)) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                       ,0xace,"fatal error");
          }
          local_40 = *(long *)(*(long *)(puVar2 + 0x28) + 0x10) * 4 *
                     *(long *)(*(long *)(puVar2 + 0x28) + 0x18) +
                     *(long *)(*(long *)(puVar2 + 0x26) + 0x10) * 4 *
                     *(long *)(*(long *)(puVar2 + 0x26) + 0x18) *
                     *(long *)(*(long *)(puVar2 + 0x26) + 0x20);
        }
        break;
      case (size_t *)0x33:
        in_stack_ffffffffffffff68 = *(ggml_tensor **)(*(long *)(puVar2 + 0x26) + 0x10);
        in_stack_ffffffffffffff60 = *(long *)(*(long *)(puVar2 + 0x26) + 0x18);
        local_40 = *(long *)(*(long *)(puVar2 + 0x28) + 0x10) * 2 *
                   *(long *)(*(long *)(puVar2 + 0x28) + 0x18) *
                   *(long *)(*(long *)(puVar2 + 0x28) + 0x20) +
                   (long)in_stack_ffffffffffffff68 * 2 * in_stack_ffffffffffffff60 *
                   *(long *)(*(long *)(puVar2 + 0x26) + 0x20) *
                   *(long *)(*(long *)(puVar2 + 0x26) + 0x28);
        break;
      case (size_t *)0x3e:
        local_40 = (*(long *)(*(long *)(puVar2 + 0x28) + 0x10) +
                   *(long *)(*(long *)(puVar2 + 0x2a) + 0x10) * 2) * 4 * (long)iVar4;
        break;
      case (size_t *)0x3f:
        lVar9 = *(long *)(*(long *)(puVar2 + 0x26) + 0x10);
        iVar5 = ggml_up(0,0x1134c3);
        local_120 = (long)iVar5;
        if (local_120 < lVar9) {
          local_120 = lVar9;
        }
        if (**(int **)(puVar2 + 0x28) == 0) {
          local_40 = local_120 * 8 * (long)iVar4 + local_120 * 8 * (long)iVar4;
        }
        else if (**(int **)(puVar2 + 0x28) == 1) {
          local_40 = local_120 * 8 * (long)iVar4 + local_120 * 8 * (long)iVar4;
        }
        else if (**(int **)(puVar2 + 0x28) == 0x1e) {
          local_40 = local_120 * 8 * (long)iVar4 + local_120 * 8 * (long)iVar4;
        }
        break;
      case (size_t *)0x4e:
        lVar9 = ggml_type_size(*puVar2);
        local_40 = lVar9 * ((long)iVar4 + *(long *)(*(long *)(puVar2 + 0x26) + 0x10) * (long)iVar4);
        break;
      case (size_t *)0x51:
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-cpu/ggml-cpu.c"
                   ,0xafd,"fatal error");
      }
    }
    if (local_40 < local_20) {
      local_128 = local_20;
    }
    else {
      local_128 = local_40;
    }
    local_20 = local_128;
    local_28 = local_28 + 1;
    local_24 = iVar10;
  } while( true );
}

Assistant:

struct ggml_cplan ggml_graph_plan(
          const struct ggml_cgraph * cgraph,
                               int   n_threads,
            struct ggml_threadpool * threadpool) {

    if (threadpool == NULL) {
        //GGML_PRINT_DEBUG("Threadpool is not specified. Will create a disposable threadpool : n_threads %d\n", n_threads);
    }
    if (n_threads <= 0) {
        n_threads = threadpool ? threadpool->n_threads_max : GGML_DEFAULT_N_THREADS;
    }

    size_t work_size = 0;

    struct ggml_cplan cplan;
    memset(&cplan, 0, sizeof(struct ggml_cplan));

    int max_tasks = 1;

    // thread scheduling for the different operations + work buffer size estimation
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * node = cgraph->nodes[i];

        const int n_tasks = ggml_get_n_tasks(node, n_threads);

        max_tasks = MAX(max_tasks, n_tasks);

        size_t cur = 0;

        if (!ggml_cpu_extra_work_size(n_threads, node, &cur)) {
            switch (node->op) {
                case GGML_OP_CPY:
                case GGML_OP_DUP:
                    {
                        if (ggml_is_quantized(node->type) ||
                            // F16 -> BF16 and BF16 -> F16 copies go through intermediate F32
                            (node->src[0]->type == GGML_TYPE_F16  && node->src[1] && node->src[1]->type == GGML_TYPE_BF16) ||
                            (node->src[0]->type == GGML_TYPE_BF16 && node->src[1] && node->src[1]->type == GGML_TYPE_F16)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_ADD:
                case GGML_OP_ADD1:
                    {
                        if (ggml_is_quantized(node->src[0]->type)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->src[0]->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_ACC:
                    {
                        if (ggml_is_quantized(node->src[0]->type)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->src[1]->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_COUNT_EQUAL:
                    {
                        cur = ggml_type_size(node->type)*n_tasks;
                    } break;
                case GGML_OP_MUL_MAT:
                    {
                        const enum ggml_type vec_dot_type = type_traits_cpu[node->src[0]->type].vec_dot_type;

                        if (node->src[1]->type != vec_dot_type) {
                            cur = ggml_row_size(vec_dot_type, ggml_nelements(node->src[1]));
                        }
                    } break;
                case GGML_OP_MUL_MAT_ID:
                    {
                        cur = 0;
                        const struct ggml_tensor * src0 = node->src[0];
                        const struct ggml_tensor * src1 = node->src[1];
                        const struct ggml_tensor * ids = node->src[2];
                        const enum ggml_type vec_dot_type = type_traits_cpu[src0->type].vec_dot_type;
                        const int n_as = src0->ne[2];
                        // src1
                        if (src1->type != vec_dot_type) {
                            cur += ggml_row_size(vec_dot_type, ggml_nelements(src1)) + sizeof(int64_t);
                        }
                        // matrix_row_counts
                        cur += n_as * sizeof(int64_t) + sizeof(int64_t);
                        // matrix_rows
                        cur += n_as*ids->ne[0]*ids->ne[1]*sizeof(struct mmid_row_mapping) + sizeof(int64_t);
                        // atomic_current_chunk
                        cur += CACHE_LINE_SIZE*n_as + CACHE_LINE_SIZE;
                    } break;
                case GGML_OP_OUT_PROD:
                    {
                        if (ggml_is_quantized(node->src[0]->type)) {
                            cur = ggml_type_size(GGML_TYPE_F32) * node->src[0]->ne[0] * n_tasks;
                        }
                    } break;
                case GGML_OP_SOFT_MAX:
                case GGML_OP_ROPE:
                case GGML_OP_ROPE_BACK:
                    {
                        cur = ggml_type_size(GGML_TYPE_F32) * node->ne[0] * n_tasks;
                    } break;
                case GGML_OP_CONV_TRANSPOSE_1D:
                    {
                        GGML_ASSERT(node->src[0]->ne[3] == 1);
                        GGML_ASSERT(node->src[1]->ne[2] == 1);
                        GGML_ASSERT(node->src[1]->ne[3] == 1);

                        const int64_t ne00 = node->src[0]->ne[0];  // K
                        const int64_t ne01 = node->src[0]->ne[1];  // Cout
                        const int64_t ne02 = node->src[0]->ne[2];  // Cin
                        const int64_t ne10 = node->src[1]->ne[0];  // L
                        const int64_t ne11 = node->src[1]->ne[1];  // Cin

                        if ((node->src[0]->type == GGML_TYPE_F16 ||
                             node->src[0]->type == GGML_TYPE_BF16) &&
                            node->src[1]->type == GGML_TYPE_F32) {
                            cur += sizeof(ggml_fp16_t)*ne00*ne01*ne02;
                            cur += sizeof(ggml_fp16_t)*ne10*ne11;
                        } else if (node->src[0]->type == GGML_TYPE_F32 &&
                                   node->src[1]->type == GGML_TYPE_F32) {
                            cur += sizeof(float)*ne00*ne01*ne02;
                            cur += sizeof(float)*ne10*ne11;
                        } else {
                            GGML_ABORT("fatal error");
                        }
                    } break;
                case GGML_OP_CONV_TRANSPOSE_2D:
                    {
                        const int64_t ne00 = node->src[0]->ne[0]; // W
                        const int64_t ne01 = node->src[0]->ne[1]; // H
                        const int64_t ne02 = node->src[0]->ne[2]; // Channels Out
                        const int64_t ne03 = node->src[0]->ne[3]; // Channels In

                        const int64_t ne10 = node->src[1]->ne[0]; // W
                        const int64_t ne11 = node->src[1]->ne[1]; // H
                        const int64_t ne12 = node->src[1]->ne[2]; // Channels In

                        cur += sizeof(ggml_fp16_t)*ne00*ne01*ne02*ne03;
                        cur += sizeof(ggml_fp16_t)*ne10*ne11*ne12;
                    } break;
                case GGML_OP_FLASH_ATTN_EXT:
                    {
                        const int64_t ne10 = node->src[1]->ne[0]; // DK
                        const int64_t ne20 = node->src[2]->ne[0]; // DV

                        cur = sizeof(float)*(1*ne10 + 2*ne20)*n_tasks; // 1x head size K + 2x head size V (per thread)
                    } break;
                case GGML_OP_FLASH_ATTN_BACK:
                    {
                        const int64_t    D = node->src[0]->ne[0];
                        const int64_t ne11 = ggml_up(node->src[1]->ne[1], GGML_SOFT_MAX_UNROLL);
                        const int64_t mxDn = MAX(D, ne11) * 2; // *2 because of S and SM in ggml_compute_forward_flash_attn_back
                        if (node->src[1]->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*mxDn*n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*mxDn*n_tasks; // this is overestimated by x2
                        } else if (node->src[1]->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*mxDn*n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*mxDn*n_tasks; // this is overestimated by x2
                        } else if (node->src[1]->type == GGML_TYPE_BF16) {
                            cur  = sizeof(float)*mxDn*n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*mxDn*n_tasks; // this is overestimated by x2
                        }
                    } break;

                case GGML_OP_CROSS_ENTROPY_LOSS:
                    {
                        cur = ggml_type_size(node->type)*(n_tasks + node->src[0]->ne[0]*n_tasks);
                    } break;
                case GGML_OP_COUNT:
                    {
                        GGML_ABORT("fatal error");
                    }
                default:
                    break;
            }
        }

        work_size = MAX(work_size, cur);
    }

    if (work_size > 0) {
        work_size += CACHE_LINE_SIZE*(n_threads);
    }

    cplan.threadpool = threadpool;
    cplan.n_threads  = MIN(max_tasks, n_threads);
    cplan.work_size  = work_size;
    cplan.work_data  = NULL;

    return cplan;
}